

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_FeatureVectorizer_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0074a1b8 == '\x01') {
    DAT_0074a1b8 = '\0';
    (*(code *)*_FeatureVectorizer_InputColumn_default_instance_)();
  }
  if (DAT_0074a1f0 == '\x01') {
    DAT_0074a1f0 = 0;
    (*(code *)*_FeatureVectorizer_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _FeatureVectorizer_InputColumn_default_instance_.Shutdown();
  _FeatureVectorizer_default_instance_.Shutdown();
}